

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReactorArkode.cpp
# Opt level: O0

int __thiscall pele::physics::reactions::ReactorArkode::init(ReactorArkode *this,EVP_PKEY_CTX *ctx)

{
  Print *this_00;
  Print *this_01;
  ostream *os_;
  Print *this_02;
  string controller_string;
  string method_string;
  ParmParse pp;
  undefined4 in_stack_fffffffffffff3a8;
  int in_stack_fffffffffffff3ac;
  Print *in_stack_fffffffffffff3b0;
  string *in_stack_fffffffffffff3b8;
  ParmParse *in_stack_fffffffffffff3c0;
  ostream *in_stack_fffffffffffff3d8;
  Print *in_stack_fffffffffffff3e0;
  Print *in_stack_fffffffffffff420;
  undefined8 in_stack_fffffffffffff428;
  int ival;
  double *in_stack_fffffffffffff430;
  char *in_stack_fffffffffffff438;
  allocator *paVar1;
  ParmParse *in_stack_fffffffffffff440;
  allocator local_e9;
  string local_e8 [39];
  allocator local_c1;
  string local_c0 [55];
  allocator local_89;
  string local_88 [124];
  int local_c;
  ReactorArkode *local_8;
  
  ival = (int)((ulong)in_stack_fffffffffffff428 >> 0x20);
  local_c = (int)ctx;
  this->m_reactor_type = local_c;
  local_8 = this;
  ReactorTypes::check_reactor_type(in_stack_fffffffffffff3ac);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"ode",&local_89);
  amrex::ParmParse::ParmParse(in_stack_fffffffffffff3c0,in_stack_fffffffffffff3b8);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  amrex::ParmParse::query
            (in_stack_fffffffffffff440,in_stack_fffffffffffff438,(int *)in_stack_fffffffffffff430,
             ival);
  amrex::ParmParse::query
            (in_stack_fffffffffffff440,in_stack_fffffffffffff438,(int *)in_stack_fffffffffffff430,
             ival);
  amrex::ParmParse::query
            (in_stack_fffffffffffff440,in_stack_fffffffffffff438,in_stack_fffffffffffff430,ival);
  amrex::ParmParse::query
            (in_stack_fffffffffffff440,in_stack_fffffffffffff438,in_stack_fffffffffffff430,ival);
  amrex::ParmParse::query
            (in_stack_fffffffffffff440,in_stack_fffffffffffff438,(int *)in_stack_fffffffffffff430,
             ival);
  amrex::ParmParse::query
            (in_stack_fffffffffffff440,in_stack_fffffffffffff438,(int *)in_stack_fffffffffffff430,
             ival);
  amrex::ParmParse::query
            (in_stack_fffffffffffff440,in_stack_fffffffffffff438,(int *)in_stack_fffffffffffff430,
             ival);
  amrex::ParmParse::query
            (in_stack_fffffffffffff440,in_stack_fffffffffffff438,(bool *)in_stack_fffffffffffff430,
             ival);
  paVar1 = &local_c1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"ARKODE_ZONNEVELD_5_3_4",paVar1);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  paVar1 = &local_e9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"PID",paVar1);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  amrex::OutStream();
  amrex::Print::Print(in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8);
  amrex::Print::operator<<
            (in_stack_fffffffffffff3b0,
             (char (*) [22])CONCAT44(in_stack_fffffffffffff3ac,in_stack_fffffffffffff3a8));
  amrex::Print::~Print(in_stack_fffffffffffff420);
  switch(this->rk_method) {
  case 0x14:
    this->rk_method = 0;
    std::__cxx11::string::operator=(local_c0,"ARKODE_HEUN_EULER_2_1_2");
    break;
  default:
    this->rk_method = 3;
    std::__cxx11::string::operator=(local_c0,"ARKODE_ZONNEVELD_5_3_4");
    break;
  case 0x1e:
    this->rk_method = 1;
    std::__cxx11::string::operator=(local_c0,"ARKODE_BOGACKI_SHAMPINE_4_2_3");
    break;
  case 0x1f:
    this->rk_method = 2;
    std::__cxx11::string::operator=(local_c0,"ARKODE_ARK324L2SA_ERK_4_2_3");
    break;
  case 0x28:
    this->rk_method = 3;
    std::__cxx11::string::operator=(local_c0,"ARKODE_ZONNEVELD_5_3_4");
    break;
  case 0x29:
    this->rk_method = 4;
    std::__cxx11::string::operator=(local_c0,"ARKODE_ARK436L2SA_ERK_6_3_4");
    break;
  case 0x2a:
    this->rk_method = 5;
    std::__cxx11::string::operator=(local_c0,"ARKODE_SAYFY_ABURUB_6_3_4");
    break;
  case 0x2b:
    this->rk_method = 0xd;
    std::__cxx11::string::operator=(local_c0,"ARKODE_ARK437L2SA_ERK_7_3_4");
    break;
  case 0x32:
    this->rk_method = 6;
    std::__cxx11::string::operator=(local_c0,"ARKODE_CASH_KARP_6_4_5");
    break;
  case 0x33:
    this->rk_method = 7;
    std::__cxx11::string::operator=(local_c0,"ARKODE_FEHLBERG_6_4_5");
    break;
  case 0x34:
    this->rk_method = 8;
    std::__cxx11::string::operator=(local_c0,"ARKODE_DORMAND_PRINCE_7_4_5");
    break;
  case 0x35:
    this->rk_method = 9;
    std::__cxx11::string::operator=(local_c0,"ARKODE_ARK548L2SA_ERK_8_4_5");
    break;
  case 0x36:
    this->rk_method = 0xe;
    std::__cxx11::string::operator=(local_c0,"ARKODE_ARK548L2SAb_ERK_8_4_5");
    break;
  case 0x3c:
    this->rk_method = 10;
    std::__cxx11::string::operator=(local_c0,"ARKODE_VERNER_8_5_6");
    break;
  case 0x50:
    this->rk_method = 0xb;
    std::__cxx11::string::operator=(local_c0,"ARKODE_FEHLBERG_13_7_8");
  }
  this_00 = (Print *)(ulong)(uint)this->rk_controller;
  switch(this_00) {
  case (Print *)0x0:
    this->rk_controller = 0;
    std::__cxx11::string::operator=(local_e8,"PID");
    break;
  case (Print *)0x1:
    this->rk_controller = 1;
    std::__cxx11::string::operator=(local_e8,"PI");
    break;
  case (Print *)0x2:
    this->rk_controller = 2;
    std::__cxx11::string::operator=(local_e8,"I");
    break;
  case (Print *)0x3:
    this->rk_controller = 3;
    std::__cxx11::string::operator=(local_e8,"explicit Gustafsson");
    break;
  default:
    this->rk_controller = 0;
    std::__cxx11::string::operator=(local_e8,"PID");
  }
  if (this->use_erkstep == 1) {
    amrex::OutStream();
    amrex::Print::Print(in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8);
    amrex::Print::operator<<
              (in_stack_fffffffffffff3b0,
               (char (*) [16])CONCAT44(in_stack_fffffffffffff3ac,in_stack_fffffffffffff3a8));
    amrex::Print::operator<<
              (in_stack_fffffffffffff3b0,
               (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                *)CONCAT44(in_stack_fffffffffffff3ac,in_stack_fffffffffffff3a8));
    amrex::Print::~Print(this_00);
  }
  else {
    amrex::OutStream();
    amrex::Print::Print(in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8);
    amrex::Print::operator<<
              (in_stack_fffffffffffff3b0,
               (char (*) [16])CONCAT44(in_stack_fffffffffffff3ac,in_stack_fffffffffffff3a8));
    amrex::Print::operator<<
              (in_stack_fffffffffffff3b0,
               (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                *)CONCAT44(in_stack_fffffffffffff3ac,in_stack_fffffffffffff3a8));
    amrex::Print::~Print(this_00);
  }
  amrex::OutStream();
  amrex::Print::Print(in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8);
  amrex::Print::operator<<
            (in_stack_fffffffffffff3b0,
             (char (*) [9])CONCAT44(in_stack_fffffffffffff3ac,in_stack_fffffffffffff3a8));
  amrex::Print::operator<<
            (in_stack_fffffffffffff3b0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff3ac,in_stack_fffffffffffff3a8));
  this_01 = amrex::Print::operator<<
                      (in_stack_fffffffffffff3b0,
                       (char (*) [8])CONCAT44(in_stack_fffffffffffff3ac,in_stack_fffffffffffff3a8));
  amrex::Print::operator<<
            (in_stack_fffffffffffff3b0,
             (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
              *)CONCAT44(in_stack_fffffffffffff3ac,in_stack_fffffffffffff3a8));
  amrex::Print::~Print(this_00);
  os_ = amrex::OutStream();
  amrex::Print::Print(this_01,os_);
  amrex::Print::operator<<
            (in_stack_fffffffffffff3b0,
             (char (*) [13])CONCAT44(in_stack_fffffffffffff3ac,in_stack_fffffffffffff3a8));
  amrex::Print::operator<<
            (in_stack_fffffffffffff3b0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff3ac,in_stack_fffffffffffff3a8));
  amrex::Print::operator<<
            (in_stack_fffffffffffff3b0,
             (char (*) [12])CONCAT44(in_stack_fffffffffffff3ac,in_stack_fffffffffffff3a8));
  amrex::Print::operator<<
            (in_stack_fffffffffffff3b0,
             (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
              *)CONCAT44(in_stack_fffffffffffff3ac,in_stack_fffffffffffff3a8));
  amrex::Print::~Print(this_00);
  if (this->atomic_reductions == 0) {
    this_02 = (Print *)amrex::OutStream();
    amrex::Print::Print(this_01,os_);
    amrex::Print::operator<<
              (this_02,(char (*) [24])CONCAT44(in_stack_fffffffffffff3ac,in_stack_fffffffffffff3a8))
    ;
    amrex::Print::~Print(this_00);
  }
  else {
    amrex::OutStream();
    amrex::Print::Print(this_01,os_);
    amrex::Print::operator<<
              (in_stack_fffffffffffff3b0,
               (char (*) [27])CONCAT44(in_stack_fffffffffffff3ac,in_stack_fffffffffffff3a8));
    amrex::Print::~Print(this_00);
  }
  std::__cxx11::string::~string(local_e8);
  std::__cxx11::string::~string(local_c0);
  amrex::ParmParse::~ParmParse((ParmParse *)0x2ad2d2);
  return 0;
}

Assistant:

int
ReactorArkode::init(int reactor_type, int /*ncells*/)
{
  BL_PROFILE("Pele::ReactorArkode::init()");
  m_reactor_type = reactor_type;
  ReactorTypes::check_reactor_type(m_reactor_type);
  amrex::ParmParse pp("ode");
  pp.query("verbose", verbose);
  pp.query("use_erkstep", use_erkstep);
  pp.query("rtol", relTol);
  pp.query("atol", absTol);
  pp.query("atomic_reductions", atomic_reductions);
  pp.query("rk_method", rk_method);
  pp.query("rk_controller", rk_controller);
  pp.query("clean_init_massfrac", m_clean_init_massfrac);
  std::string method_string = "ARKODE_ZONNEVELD_5_3_4";
  std::string controller_string = "PID";

  amrex::Print() << "Initializing ARKODE:\n";

  switch (rk_method) {
  case 20:
    rk_method = ARKODE_HEUN_EULER_2_1_2;
    method_string = "ARKODE_HEUN_EULER_2_1_2";
    break;
  case 30:
    rk_method = ARKODE_BOGACKI_SHAMPINE_4_2_3;
    method_string = "ARKODE_BOGACKI_SHAMPINE_4_2_3";
    break;
  case 31:
    rk_method = ARKODE_ARK324L2SA_ERK_4_2_3;
    method_string = "ARKODE_ARK324L2SA_ERK_4_2_3";
    break;
  case 40:
    rk_method = ARKODE_ZONNEVELD_5_3_4;
    method_string = "ARKODE_ZONNEVELD_5_3_4";
    break;
  case 41:
    rk_method = ARKODE_ARK436L2SA_ERK_6_3_4;
    method_string = "ARKODE_ARK436L2SA_ERK_6_3_4";
    break;
  case 42:
    rk_method = ARKODE_SAYFY_ABURUB_6_3_4;
    method_string = "ARKODE_SAYFY_ABURUB_6_3_4";
    break;
  case 43:
    rk_method = ARKODE_ARK437L2SA_ERK_7_3_4;
    method_string = "ARKODE_ARK437L2SA_ERK_7_3_4";
    break;
  case 50:
    rk_method = ARKODE_CASH_KARP_6_4_5;
    method_string = "ARKODE_CASH_KARP_6_4_5";
    break;
  case 51:
    rk_method = ARKODE_FEHLBERG_6_4_5;
    method_string = "ARKODE_FEHLBERG_6_4_5";
    break;
  case 52:
    rk_method = ARKODE_DORMAND_PRINCE_7_4_5;
    method_string = "ARKODE_DORMAND_PRINCE_7_4_5";
    break;
  case 53:
    rk_method = ARKODE_ARK548L2SA_ERK_8_4_5;
    method_string = "ARKODE_ARK548L2SA_ERK_8_4_5";
    break;
  case 54:
    rk_method = ARKODE_ARK548L2SAb_ERK_8_4_5;
    method_string = "ARKODE_ARK548L2SAb_ERK_8_4_5";
    break;
  case 60:
    rk_method = ARKODE_VERNER_8_5_6;
    method_string = "ARKODE_VERNER_8_5_6";
    break;
  case 80:
    rk_method = ARKODE_FEHLBERG_13_7_8;
    method_string = "ARKODE_FEHLBERG_13_7_8";
    break;
  default:
    rk_method = ARKODE_ZONNEVELD_5_3_4;
    method_string = "ARKODE_ZONNEVELD_5_3_4";
    break;
  }

  switch (rk_controller) {
  case 0:
    rk_controller = ARK_ADAPT_PID;
    controller_string = "PID";
    break;
  case 1:
    rk_controller = ARK_ADAPT_PI;
    controller_string = "PI";
    break;
  case 2:
    rk_controller = ARK_ADAPT_I;
    controller_string = "I";
    break;
  case 3:
    rk_controller = ARK_ADAPT_EXP_GUS;
    controller_string = "explicit Gustafsson";
    break;
  default:
    rk_controller = ARK_ADAPT_PID;
    controller_string = "PID";
    break;
  }

  if (use_erkstep == 1) {
    amrex::Print() << "  Using ERKStep" << std::endl;
  } else {
    amrex::Print() << "  Using ARKStep" << std::endl;
  }
  amrex::Print() << "  Using " << method_string << " method" << std::endl;
  amrex::Print() << "  Using the " << controller_string << " controller"
                 << std::endl;

  if (atomic_reductions != 0) {
    amrex::Print() << "  Using atomic reductions\n";
  } else {
    amrex::Print() << "  Using LDS reductions\n";
  }

  return (0);
}